

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dto.h
# Opt level: O2

string * dto::marshall<dto::Complex>(string *__return_storage_ptr__,Complex *dto)

{
  ulong uVar1;
  ulong uVar2;
  size_type sVar3;
  pointer pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint64_t uVar7;
  
  uVar1 = (dto->header).cmd_seq;
  uVar2 = (dto->header).param;
  (dto->header).cmd_seq =
       uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
       (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
       (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  (dto->header).param =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  sVar3 = (dto->payload)._M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)sVar3 + '\x1a');
  pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
  uVar5 = *(undefined8 *)(dto->header).cmd;
  uVar6 = *(undefined8 *)((dto->header).cmd + 8);
  uVar7 = (dto->header).param;
  *(uint64_t *)(pcVar4 + 10) = (dto->header).cmd_seq;
  *(uint64_t *)(pcVar4 + 0x12) = uVar7;
  *(undefined8 *)pcVar4 = uVar5;
  *(undefined8 *)(pcVar4 + 8) = uVar6;
  memcpy((__return_storage_ptr__->_M_dataplus)._M_p + 0x1a,(dto->payload)._M_dataplus._M_p,
         (dto->payload)._M_string_length);
  uVar1 = (dto->header).cmd_seq;
  uVar2 = (dto->header).param;
  (dto->header).cmd_seq =
       uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
       (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
       (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  (dto->header).param =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  return __return_storage_ptr__;
}

Assistant:

inline std::string marshall(T &dto) {
  do_hton(&(dto.header));
  int hdr_size = sizeof(decltype(dto.header));
  std::string str(hdr_size + dto.payload.size(), '\0');
  memcpy(&str[0], &(dto.header), hdr_size);
  memcpy(&str[hdr_size], &dto.payload[0], dto.payload.size());
  do_ntoh(&(dto.header));
  return str;
}